

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O3

void Abc_ObjAddFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  Abc_Ntk_t *pAVar1;
  int *pEntry;
  char *pEntry_00;
  int *piVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  Mem_Step_t *p;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x57,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  plVar10 = (long *)((ulong)pFanin & 0xfffffffffffffffe);
  pAVar1 = pObj->pNtk;
  if (pAVar1 != (Abc_Ntk_t *)*plVar10) {
    __assert_fail("pObj->pNtk == pFaninR->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x58,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if ((pObj->Id < 0) || (lVar5 = plVar10[2], (int)lVar5 < 0)) {
    __assert_fail("pObj->Id >= 0 && pFaninR->Id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x59,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  uVar6 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar6 == 2) || ((*(uint *)((long)plVar10 + 0x14) & 0xf) == 3)) {
    __assert_fail("!Abc_ObjIsPi(pObj) && !Abc_ObjIsPo(pFaninR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x5a,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (uVar6 - 5 < 0xfffffffe) {
    if (uVar6 != 6) goto LAB_0084b0b2;
    if ((pObj->vFanins).nSize != 0) {
      __assert_fail("!Abc_ObjIsNet(pObj) || !Abc_ObjFaninNum(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                    ,0x5c,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
    }
    p = pAVar1->pMmStep;
    iVar8 = 0;
    if ((pObj->vFanins).nCap != 0) goto LAB_0084b0ef;
LAB_0084b0cd:
    (pObj->vFanins).nCap = 1;
    iVar8 = 1;
  }
  else {
    if ((pObj->vFanins).nSize != 0) {
      __assert_fail("!Abc_ObjIsCo(pObj) || !Abc_ObjFaninNum(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                    ,0x5b,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
    }
LAB_0084b0b2:
    iVar8 = (pObj->vFanins).nSize;
    p = pAVar1->pMmStep;
    if (iVar8 != (pObj->vFanins).nCap) {
LAB_0084b0ef:
      piVar2 = (pObj->vFanins).pArray;
      goto LAB_0084b15f;
    }
    if (iVar8 == 0) goto LAB_0084b0cd;
  }
  piVar7 = &(pObj->vFanins).nSize;
  if (p == (Mem_Step_t *)0x0) {
    piVar2 = (int *)malloc((long)(iVar8 * 2) << 2);
  }
  else {
    piVar2 = (int *)Mem_StepEntryFetch(p,iVar8 << 3);
  }
  pEntry = (pObj->vFanins).pArray;
  if (pEntry != (int *)0x0) {
    if (0 < *piVar7) {
      lVar3 = 0;
      do {
        piVar2[lVar3] = pEntry[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 < *piVar7);
    }
    if (p == (Mem_Step_t *)0x0) {
      free(pEntry);
    }
    else {
      Mem_StepEntryRecycle(p,(char *)pEntry,(pObj->vFanins).nCap << 2);
    }
  }
  (pObj->vFanins).nCap = (pObj->vFanins).nCap << 1;
  (pObj->vFanins).pArray = piVar2;
  iVar8 = (pObj->vFanins).nSize;
  p = pObj->pNtk->pMmStep;
LAB_0084b15f:
  piVar7 = &(pObj->vFanins).nSize;
  *piVar7 = iVar8 + 1;
  piVar2[iVar8] = (int)lVar5;
  iVar8 = pObj->Id;
  iVar9 = *(int *)((long)plVar10 + 0x2c);
  if (iVar9 == (int)plVar10[5]) {
    if (iVar9 == 0) {
      *(undefined4 *)(plVar10 + 5) = 1;
      iVar9 = 1;
    }
    if (p == (Mem_Step_t *)0x0) {
      pcVar4 = (char *)malloc((long)(iVar9 * 2) << 2);
    }
    else {
      pcVar4 = Mem_StepEntryFetch(p,iVar9 << 3);
    }
    pEntry_00 = (char *)plVar10[6];
    if (pEntry_00 != (char *)0x0) {
      if (0 < *(int *)((long)plVar10 + 0x2c)) {
        lVar5 = 0;
        do {
          *(undefined4 *)(pcVar4 + lVar5 * 4) = *(undefined4 *)(pEntry_00 + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)((long)plVar10 + 0x2c));
      }
      if (p == (Mem_Step_t *)0x0) {
        free(pEntry_00);
      }
      else {
        Mem_StepEntryRecycle(p,pEntry_00,(int)plVar10[5] << 2);
      }
    }
    *(int *)(plVar10 + 5) = (int)plVar10[5] << 1;
    plVar10[6] = (long)pcVar4;
    iVar9 = *(int *)((long)plVar10 + 0x2c);
  }
  else {
    pcVar4 = (char *)plVar10[6];
  }
  *(int *)((long)plVar10 + 0x2c) = iVar9 + 1;
  *(int *)(pcVar4 + (long)iVar9 * 4) = iVar8;
  if (((ulong)pFanin & 1) != 0) {
    iVar8 = *piVar7;
    if (1 < iVar8 - 1U) {
      __assert_fail("i >=0 && i < 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x17e,"void Abc_ObjSetFaninC(Abc_Obj_t *, int)");
    }
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | (uint)(iVar8 != 1) * 0x400 + 0x400;
  }
  return;
}

Assistant:

void Abc_ObjAddFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pFaninR = Abc_ObjRegular(pFanin);
    assert( !Abc_ObjIsComplement(pObj) );
    assert( pObj->pNtk == pFaninR->pNtk );
    assert( pObj->Id >= 0 && pFaninR->Id >= 0 );
    assert( !Abc_ObjIsPi(pObj) && !Abc_ObjIsPo(pFaninR) );    // fanin of PI or fanout of PO
    assert( !Abc_ObjIsCo(pObj) || !Abc_ObjFaninNum(pObj) );  // CO with two fanins
    assert( !Abc_ObjIsNet(pObj) || !Abc_ObjFaninNum(pObj) ); // net with two fanins
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pObj->vFanins,     pFaninR->Id );
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pFaninR->vFanouts, pObj->Id    );
    if ( Abc_ObjIsComplement(pFanin) )
        Abc_ObjSetFaninC( pObj, Abc_ObjFaninNum(pObj)-1 );
}